

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

void __thiscall VertexClustering::build(VertexClustering *this)

{
  int num;
  int num_00;
  _Rb_tree_color _Var1;
  _Map_pointer ppVVar2;
  _Elt_pointer pVVar3;
  VCFace *pVVar4;
  VCFace *pVVar5;
  bool bVar6;
  VertexGroup *pVVar7;
  pointer ppVVar8;
  iterator iVar9;
  _Rb_tree_node_base *p_Var10;
  clock_t cVar11;
  long lVar12;
  ulong uVar13;
  VCPair pair;
  set<int,_std::less<int>,_std::allocator<int>_> cset;
  key_type local_e0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d8;
  clock_t local_a0;
  Vec3d local_98;
  Vertex local_80;
  
  puts("start to rebuild the mesh from the clusters");
  local_a0 = clock();
  pVVar7 = this->vGroupNew;
  if (pVVar7 != (VertexGroup *)0x0) {
    VertexGroup::~VertexGroup(pVVar7);
    operator_delete(pVVar7);
  }
  pVVar7 = (VertexGroup *)operator_new(0x4c4b410);
  VertexGroup::VertexGroup(pVVar7);
  this->vGroupNew = pVVar7;
  ppVVar8 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(this->clusters).
                        super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppVVar8)) {
    uVar13 = 1;
    do {
      pVVar7 = this->vGroupNew;
      (*ppVVar8[uVar13]->_vptr_VCCluster[7])(&local_d8);
      local_98.x = (double)local_d8._M_impl._0_8_;
      local_98.z = (double)local_d8._M_impl.super__Rb_tree_header._M_header._M_parent;
      Vertex::Vertex(&local_80,&local_98);
      VertexGroup::addVertex(pVVar7,&local_80);
      Vertex::~Vertex(&local_80);
      Vec3d::~Vec3d(&local_98);
      if (((this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar13]->items)._M_t._M_impl.super__Rb_tree_header.
          _M_node_count == 0) {
        VertexGroup::delVertex(this->vGroupNew,(int)uVar13);
      }
      uVar13 = uVar13 + 1;
      ppVVar8 = (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->clusters).
                                    super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar8 >> 3))
    ;
  }
  while (ppVVar2 = (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node,
        pVVar3 = (this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur,
        ((long)(this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
               super__Deque_impl_data._M_start._M_last - (long)pVVar3 >> 4) +
        ((long)(this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 4) +
        ((((ulong)((long)ppVVar2 -
                  (long)(this->boundary).c.super__Deque_base<VCEdge,_std::allocator<VCEdge>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
        (ulong)(ppVVar2 == (_Map_pointer)0x0)) * 0x20 != 0) {
    pVVar4 = pVVar3->f1;
    pVVar5 = pVVar3->f2;
    std::deque<VCEdge,_std::allocator<VCEdge>_>::pop_front(&(this->boundary).c);
    if ((pVVar4 != (VCFace *)0x0 && pVVar5 != (VCFace *)0x0) && (pVVar4->cluster != pVVar5->cluster)
       ) {
      num = pVVar4->cluster->id;
      num_00 = pVVar5->cluster->id;
      Vertex::addNeighborVertex((Vertex *)(&this->vGroupNew->field_0x0 + (long)num * 0x50),num_00);
      Vertex::addNeighborVertex((Vertex *)(&this->vGroupNew->field_0x0 + (long)num_00 * 0x50),num);
    }
  }
  pVVar7 = this->vGroup;
  if (0 < pVVar7->cntVertex) {
    lVar12 = 1;
    do {
      if (pVVar7->isDeleted[lVar12] == false) {
        local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d8._M_impl.super__Rb_tree_header._M_header;
        local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
        for (p_Var10 = *(_Rb_tree_node_base **)(&pVVar7->field_0x38 + lVar12 * 0x50);
            p_Var10 != (_Rb_tree_node_base *)(&pVVar7->field_0x28 + lVar12 * 0x50);
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          _Var1 = p_Var10[1]._M_color;
          local_e0.a = (int)lVar12;
          local_e0.b = _Var1;
          if ((int)_Var1 < local_e0.a) {
            local_e0.b = local_e0.a;
            local_e0.a = _Var1;
          }
          iVar9 = std::
                  _Rb_tree<VCPair,_std::pair<const_VCPair,_VCEdge>,_std::_Select1st<std::pair<const_VCPair,_VCEdge>_>,_VCEdgeItemCmp,_std::allocator<std::pair<const_VCPair,_VCEdge>_>_>
                  ::find(&(this->edgeMap)._M_t,&local_e0);
          if ((_Rb_tree_header *)iVar9._M_node !=
              &(this->edgeMap)._M_t._M_impl.super__Rb_tree_header) {
            if (iVar9._M_node[1]._M_parent != (_Base_ptr)0x0) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_d8,(int *)(*(long *)(iVar9._M_node[1]._M_parent + 10) + 8));
            }
            if (iVar9._M_node[1]._M_left != (_Base_ptr)0x0) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_d8,(int *)(*(long *)(iVar9._M_node[1]._M_left + 10) + 8));
            }
          }
        }
        if (3 < local_d8._M_impl.super__Rb_tree_header._M_node_count) {
          localRefine(this,(set<int,_std::less<int>,_std::allocator<int>_> *)&local_d8);
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_d8);
      }
      pVVar7 = this->vGroup;
      bVar6 = lVar12 < pVVar7->cntVertex;
      lVar12 = lVar12 + 1;
    } while (bVar6);
  }
  cVar11 = clock();
  printf("Done, uses %lf s for building.\n",(double)(cVar11 - local_a0) / 1000000.0);
  return;
}

Assistant:

void VertexClustering::build()
{
	printf("start to rebuild the mesh from the clusters\n");
	clock_t start = clock();
	if (vGroupNew)
		delete vGroupNew;
	vGroupNew = new VertexGroup();
	for (int i = 1; i < clusters.size(); i++) {
		vGroupNew->addVertex(Vertex(VCEigenToMyvec(clusters[i]->center())));
		if (clusters[i]->size() == 0)
			vGroupNew->delVertex(i);
	}

	while(boundary.size() > 0) {
		VCEdge e = boundary.front();
		boundary.pop();
		if (e.isBoundary()) {
			int v1 = e.f1->cluster->id;
			int v2 = e.f2->cluster->id;
			vGroupNew->group[v1].addNeighborVertex(v2);
			vGroupNew->group[v2].addNeighborVertex(v1);
		}
	}
	//refine
	for (int i = 1; i <= vGroup->cntVertex; i++) {
		if (vGroup->isDeleted[i])
			continue;
		set<int> cset;
		Vertex* v = &vGroup->group[i];
		for (int u : v->neighborVertexIds) {
			VCPair pair(min(i, u), max(i, u));
			auto edgeIt = edgeMap.find(pair);
			if (edgeIt != edgeMap.end()) {
				if(edgeIt->second.f1)
					cset.insert(edgeIt->second.f1->cluster->id);
				if(edgeIt->second.f2)
					cset.insert(edgeIt->second.f2->cluster->id);
			}
		}
		if (cset.size() >= 4) {
			localRefine(cset);
		}
	}
	printf("Done, uses %lf s for building.\n", (double)(clock() - start) / CLOCKS_PER_SEC);
}